

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void * a0ialloc(size_t size,_Bool zero,_Bool is_internal)

{
  ulong *puVar1;
  long *plVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  undefined8 uVar6;
  _Bool _Var7;
  szind_t ind;
  void *key;
  ulong uVar8;
  rtree_leaf_elm_t *prVar9;
  atomic_p_t arena;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  rtree_ctx_t rtree_ctx_fallback;
  ulong auStack_1c0 [3];
  rtree_ctx_t rStack_1a8;
  
  if (duckdb_je_malloc_init_state == malloc_init_uninitialized) {
    auStack_1c0[2] = 0x114bb20;
    _Var7 = malloc_init_hard_a0();
    if (_Var7) {
      return (void *)0x0;
    }
  }
  if (size < 0x1001) {
    ind = (szind_t)duckdb_je_sz_size2index_tab[size + 7 >> 3];
  }
  else {
    auStack_1c0[2] = 0x114bb34;
    ind = sz_size2index_compute(size);
  }
  arena.repr = duckdb_je_arenas[0].repr;
  if (duckdb_je_arenas[0].repr == (void *)0x0) {
    auStack_1c0[2] = 0x114bb4c;
    arena.repr = duckdb_je_arena_init((tsdn_t *)0x0,0,&duckdb_je_arena_config_default);
  }
  auStack_1c0[2] = 0x114ba56;
  key = duckdb_je_arena_malloc_hard((tsdn_t *)0x0,arena.repr,size,ind,zero,size < 0x3801);
  if ((is_internal) && (key != (void *)0x0)) {
    auStack_1c0[2] = 0x114ba73;
    duckdb_je_rtree_ctx_data_init(&rStack_1a8);
    prVar9 = rStack_1a8.l2_cache[0].leaf;
    uVar12 = (uint)((ulong)key >> 0x1e) & 0xf;
    uVar11 = (ulong)key & 0xffffffffc0000000;
    uVar8 = (ulong)(uVar12 << 4);
    puVar1 = (ulong *)((long)&rStack_1a8.cache[0].leafkey + uVar8);
    uVar3 = *puVar1;
    if (uVar3 == uVar11) {
      prVar9 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
               *(long *)((long)&rStack_1a8.cache[0].leaf + uVar8));
    }
    else if (rStack_1a8.l2_cache[0].leafkey == uVar11) {
      rStack_1a8.l2_cache[0].leafkey = uVar3;
      rStack_1a8.l2_cache[0].leaf = *(rtree_leaf_elm_t **)((long)&rStack_1a8.cache[0].leaf + uVar8);
      *puVar1 = uVar11;
      *(rtree_leaf_elm_t **)((long)&rStack_1a8.cache[0].leaf + uVar8) = prVar9;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      lVar10 = 0x118;
      do {
        if (*(ulong *)((long)rStack_1a8.cache + lVar10 + -8) == uVar11) {
          lVar5 = *(long *)((long)&rStack_1a8.cache[0].leafkey + lVar10);
          uVar6 = *(undefined8 *)((long)auStack_1c0 + lVar10 + 8);
          *(undefined8 *)((long)rStack_1a8.cache + lVar10 + -8) =
               *(undefined8 *)((long)auStack_1c0 + lVar10);
          *(undefined8 *)((long)&rStack_1a8.cache[0].leafkey + lVar10) = uVar6;
          *(ulong *)((long)auStack_1c0 + lVar10) = uVar3;
          *(undefined8 *)((long)auStack_1c0 + lVar10 + 8) =
               *(undefined8 *)((long)&rStack_1a8.cache[0].leaf + uVar8);
          *puVar1 = uVar11;
          *(long *)((long)&rStack_1a8.cache[0].leaf + uVar8) = lVar5;
          prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + lVar5);
          goto LAB_0114baac;
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x188);
      auStack_1c0[2] = 0x114bc08;
      prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&rStack_1a8,
                          (uintptr_t)key,true,false);
    }
LAB_0114baac:
    pvVar4 = duckdb_je_arenas
             [*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
             ].repr;
    auStack_1c0[2] = 0x114bace;
    duckdb_je_rtree_ctx_data_init(&rStack_1a8);
    uVar8 = (ulong)(uVar12 << 4);
    puVar1 = (ulong *)((long)&rStack_1a8.cache[0].leafkey + uVar8);
    uVar3 = *puVar1;
    if (uVar3 == uVar11) {
      prVar9 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
               *(long *)((long)&rStack_1a8.cache[0].leaf + uVar8));
    }
    else if (rStack_1a8.l2_cache[0].leafkey == uVar11) {
      rStack_1a8.l2_cache[0].leafkey = uVar3;
      *puVar1 = uVar11;
      *(rtree_leaf_elm_t **)((long)&rStack_1a8.cache[0].leaf + uVar8) = rStack_1a8.l2_cache[0].leaf;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&((rStack_1a8.l2_cache[0].leaf)->le_bits).repr +
               (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      lVar10 = 0x118;
      do {
        if (*(ulong *)((long)rStack_1a8.cache + lVar10 + -8) == uVar11) {
          lVar5 = *(long *)((long)&rStack_1a8.cache[0].leafkey + lVar10);
          uVar6 = *(undefined8 *)((long)auStack_1c0 + lVar10 + 8);
          *(undefined8 *)((long)rStack_1a8.cache + lVar10 + -8) =
               *(undefined8 *)((long)auStack_1c0 + lVar10);
          *(undefined8 *)((long)&rStack_1a8.cache[0].leafkey + lVar10) = uVar6;
          *(ulong *)((long)auStack_1c0 + lVar10) = uVar3;
          *(undefined8 *)((long)auStack_1c0 + lVar10 + 8) =
               *(undefined8 *)((long)&rStack_1a8.cache[0].leaf + uVar8);
          *puVar1 = uVar11;
          *(long *)((long)&rStack_1a8.cache[0].leaf + uVar8) = lVar5;
          prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + lVar5);
          goto LAB_0114baf0;
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x188);
      auStack_1c0[2] = 0x114bc43;
      prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&rStack_1a8,
                          (uintptr_t)key,true,false);
    }
LAB_0114baf0:
    LOCK();
    plVar2 = (long *)((long)pvVar4 + 0x48);
    *plVar2 = *plVar2 + duckdb_je_sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
    UNLOCK();
  }
  return key;
}

Assistant:

static void *
a0ialloc(size_t size, bool zero, bool is_internal) {
	if (unlikely(malloc_init_a0())) {
		return NULL;
	}

	return iallocztm(TSDN_NULL, size, sz_size2index(size), zero, NULL,
	    is_internal, arena_get(TSDN_NULL, 0, true), true);
}